

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O2

void msd_D<counting_list<unsigned_char*>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,counting_list<unsigned_char_*> *buckets)

{
  ushort uVar1;
  uint j;
  long lVar2;
  size_t *psVar3;
  uchar **x;
  uint j_1;
  counting_list<unsigned_char_*> *bucket;
  ulong n_00;
  uint i_1;
  uchar **x_00;
  uint i;
  ulong uVar4;
  long lVar5;
  array<unsigned_short,_256UL> bucketsize;
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
    return;
  }
  x_00 = strings;
  for (uVar4 = 0; uVar4 < (n & 0xffffffffffffffe0); uVar4 = uVar4 + 0x20) {
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      *(uchar *)((long)bucketsize._M_elems + lVar2) = x_00[lVar2][depth];
    }
    x = x_00;
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
      counting_list<unsigned_char_*>::push_back
                (buckets + *(byte *)((long)bucketsize._M_elems + lVar2),x);
      x = x + 1;
    }
    x_00 = x_00 + 0x20;
  }
  for (; uVar4 < n; uVar4 = uVar4 + 1) {
    counting_list<unsigned_char_*>::push_back(buckets + (*x_00)[depth],x_00);
    x_00 = x_00 + 1;
  }
  psVar3 = &buckets->_size;
  for (lVar2 = 0; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    bucketsize._M_elems[lVar2] = (unsigned_short)*psVar3;
    psVar3 = psVar3 + 4;
  }
  lVar2 = 0;
  bucket = buckets;
  for (lVar5 = 0; lVar5 != 0x100; lVar5 = lVar5 + 1) {
    uVar1 = bucketsize._M_elems[lVar5];
    if ((ulong)uVar1 != 0) {
      copy<counting_list<unsigned_char*>,unsigned_char**>(bucket,strings + lVar2);
      lVar2 = lVar2 + (ulong)uVar1;
    }
    bucket = bucket + 1;
  }
  for (lVar2 = 0; lVar2 != 0x2000; lVar2 = lVar2 + 0x20) {
    counting_list<unsigned_char_*>::clear
              ((counting_list<unsigned_char_*> *)
               ((long)&(buckets->super_list<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                       super__List_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>._M_impl.
                       _M_node.super__List_node_base._M_next + lVar2));
  }
  uVar4 = (ulong)bucketsize._M_elems[0];
  for (lVar2 = 1; lVar2 != 0x100; lVar2 = lVar2 + 1) {
    n_00 = (ulong)bucketsize._M_elems[lVar2];
    if (n_00 != 0) {
      msd_D<counting_list<unsigned_char*>,unsigned_short>(strings + uVar4,n_00,depth + 1,buckets);
      uVar4 = uVar4 + n_00;
    }
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}